

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

bool icu_63::anon_unknown_0::equalBlocks(uint16_t *s,uint16_t *t,int32_t length)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = length >> 0x1f & length;
  lVar2 = 0;
  do {
    if (length < 1) {
LAB_002a6163:
      return uVar1 == 0;
    }
    if (*(short *)((long)s + lVar2) != *(short *)((long)t + lVar2)) {
      uVar1 = 1;
      goto LAB_002a6163;
    }
    length = length + -1;
    lVar2 = lVar2 + 2;
  } while( true );
}

Assistant:

inline bool
equalBlocks(const uint16_t *s, const uint16_t *t, int32_t length) {
    while (length > 0 && *s == *t) {
        ++s;
        ++t;
        --length;
    }
    return length == 0;
}